

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SslSocket.cpp
# Opt level: O0

int __thiscall
SslUdpSocketImpl::DatenEncode(SslUdpSocketImpl *this,uint8_t *buf,size_t nAnzahl,string *strAddress)

{
  int iVar1;
  pointer pSVar2;
  size_t sVar3;
  type puVar4;
  type this_00;
  SSL *__val;
  wchar_t *pOut;
  bool bVar5;
  wstring local_100;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_e0;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_c0;
  __int_type local_a0;
  size_t len_1;
  __array temp_1;
  size_t nOutDataSize;
  unique_lock<std::mutex> lock;
  size_t len;
  __array temp;
  size_t local_58;
  size_t nOutDataSize_1;
  unique_lock<std::mutex> lock_1;
  size_t nWritten;
  int iErrorHint;
  int iSslInit;
  string *strAddress_local;
  size_t nAnzahl_local;
  uint8_t *buf_local;
  SslUdpSocketImpl *this_local;
  
  if ((this->m_bCloseReq & 1U) == 1) {
    this_local._4_4_ = -1;
  }
  else {
    _iErrorHint = strAddress;
    strAddress_local = (string *)nAnzahl;
    nAnzahl_local = (size_t)buf;
    buf_local = (uint8_t *)this;
    pSVar2 = std::
             unique_ptr<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
             ::operator->(&this->m_pSslCon);
    iVar1 = OpenSSLWrapper::SslConnection::SSLGetShutdown(pSVar2);
    if (iVar1 < 1) {
      if ((nAnzahl_local == 0) || (strAddress_local == (string *)0x0)) {
        this_local._4_4_ = 0;
      }
      else {
        pSVar2 = std::
                 unique_ptr<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                 ::operator->(&this->m_pSslCon);
        nWritten._4_4_ = OpenSSLWrapper::SslConnection::SslInitFinished(pSVar2);
        if (nWritten._4_4_ == 1) {
          nWritten._0_4_ = 0;
          pSVar2 = std::
                   unique_ptr<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                   ::operator->(&this->m_pSslCon);
          lock_1._8_8_ = OpenSSLWrapper::SslConnection::SslWrite
                                   (pSVar2,(uint8_t *)nAnzahl_local,(size_t)strAddress_local,
                                    (int *)&nWritten);
          while( true ) {
            bVar5 = false;
            if (((ulong)lock_1._8_8_ < strAddress_local) &&
               ((((int)nWritten == 0 || ((int)nWritten == 2)) || (bVar5 = false, (int)nWritten == 3)
                ))) {
              pSVar2 = std::
                       unique_ptr<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                       ::operator->(&this->m_pSslCon);
              iVar1 = OpenSSLWrapper::SslConnection::GetShutDownFlag(pSVar2);
              bVar5 = iVar1 == -0x80000000;
            }
            if (!bVar5) break;
            std::unique_lock<std::mutex>::unique_lock
                      ((unique_lock<std::mutex> *)&nOutDataSize_1,&this->m_mxEnDecode);
            pSVar2 = std::
                     unique_ptr<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                     ::operator->(&this->m_pSslCon);
            local_58 = OpenSSLWrapper::SslConnection::SslGetOutDataSize(pSVar2);
            while (local_58 != 0) {
              std::make_unique<unsigned_char[]>((size_t)&len);
              pSVar2 = std::
                       unique_ptr<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                       ::operator->(&this->m_pSslCon);
              puVar4 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::
                       operator[]((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>
                                   *)&len,0);
              lock._8_8_ = OpenSSLWrapper::SslConnection::SslGetOutData(pSVar2,puVar4,local_58);
              if (lock._8_8_ != 0) {
                std::mutex::lock(&(this->super_UdpSocketImpl).m_mxOutDeque);
                std::__atomic_base<unsigned_long>::operator+=
                          (&(this->super_UdpSocketImpl).m_atOutBytes.
                            super___atomic_base<unsigned_long>,lock._8_8_);
                std::
                deque<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>,std::allocator<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>>>
                ::
                emplace_back<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long_const&,std::__cxx11::string_const&>
                          ((deque<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>,std::allocator<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>>>
                            *)&(this->super_UdpSocketImpl).m_quOutData,
                           (unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                           &len,(unsigned_long *)&lock._M_owns,_iErrorHint);
                std::mutex::unlock(&(this->super_UdpSocketImpl).m_mxOutDeque);
              }
              pSVar2 = std::
                       unique_ptr<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                       ::operator->(&this->m_pSslCon);
              local_58 = OpenSSLWrapper::SslConnection::SslGetOutDataSize(pSVar2);
              std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
                        ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)&len)
              ;
            }
            std::unique_lock<std::mutex>::unlock((unique_lock<std::mutex> *)&nOutDataSize_1);
            pSVar2 = std::
                     unique_ptr<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                     ::operator->(&this->m_pSslCon);
            sVar3 = OpenSSLWrapper::SslConnection::SslWrite
                              (pSVar2,(uint8_t *)(nAnzahl_local + lock_1._8_8_),
                               (long)strAddress_local - lock_1._8_8_,(int *)&nWritten);
            lock_1._8_8_ = sVar3 + lock_1._8_8_;
            std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&nOutDataSize_1);
          }
          std::unique_lock<std::mutex>::unique_lock
                    ((unique_lock<std::mutex> *)&nOutDataSize,&this->m_mxEnDecode);
          pSVar2 = std::
                   unique_ptr<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                   ::operator->(&this->m_pSslCon);
          temp_1._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
          _M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
          super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
               (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)
               OpenSSLWrapper::SslConnection::SslGetOutDataSize(pSVar2);
          while ((__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>)
                 temp_1._M_t.
                 super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                 super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl !=
                 (__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>)0x0) {
            std::make_unique<unsigned_char[]>((size_t)&len_1);
            pSVar2 = std::
                     unique_ptr<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                     ::operator->(&this->m_pSslCon);
            puVar4 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::
                     operator[]((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>
                                 *)&len_1,0);
            local_a0 = OpenSSLWrapper::SslConnection::SslGetOutData
                                 (pSVar2,puVar4,
                                  (size_t)temp_1._M_t.
                                          super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                                          .super__Head_base<0UL,_unsigned_char_*,_false>.
                                          _M_head_impl);
            if (local_a0 != 0) {
              std::mutex::lock(&(this->super_UdpSocketImpl).m_mxOutDeque);
              std::__atomic_base<unsigned_long>::operator+=
                        (&(this->super_UdpSocketImpl).m_atOutBytes.
                          super___atomic_base<unsigned_long>,local_a0);
              std::
              deque<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>,std::allocator<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>>>
              ::
              emplace_back<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long_const&,std::__cxx11::string_const&>
                        ((deque<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>,std::allocator<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>>>
                          *)&(this->super_UdpSocketImpl).m_quOutData,
                         (unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                         &len_1,&local_a0,_iErrorHint);
              std::mutex::unlock(&(this->super_UdpSocketImpl).m_mxOutDeque);
            }
            pSVar2 = std::
                     unique_ptr<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                     ::operator->(&this->m_pSslCon);
            temp_1._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
            _M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
            super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
                 (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)
                 OpenSSLWrapper::SslConnection::SslGetOutDataSize(pSVar2);
            std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
                      ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)&len_1)
            ;
          }
          std::unique_lock<std::mutex>::unlock((unique_lock<std::mutex> *)&nOutDataSize);
          this_local._4_4_ = 1;
          std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&nOutDataSize);
        }
        else {
          this_00 = std::
                    unique_ptr<OpenSSLWrapper::SslConnection,_std::default_delete<OpenSSLWrapper::SslConnection>_>
                    ::operator*(&this->m_pSslCon);
          __val = OpenSSLWrapper::SslConnection::operator()(this_00);
          std::__cxx11::to_wstring(&local_100,(unsigned_long)__val);
          std::operator+(&local_e0,L"SSL not initialized: ",&local_100);
          std::operator+(&local_c0,&local_e0,L"\r\n");
          pOut = (wchar_t *)std::__cxx11::wstring::c_str();
          OutputDebugString(pOut);
          std::__cxx11::wstring::~wstring((wstring *)&local_c0);
          std::__cxx11::wstring::~wstring((wstring *)&local_e0);
          std::__cxx11::wstring::~wstring((wstring *)&local_100);
          this_local._4_4_ = 0;
        }
      }
    }
    else {
      this_local._4_4_ = -1;
    }
  }
  return this_local._4_4_;
}

Assistant:

int SslUdpSocketImpl::DatenEncode(const uint8_t* buf, size_t nAnzahl, const string& strAddress)
{
    if (m_bCloseReq == true)
        return -1;
    if (m_pSslCon->SSLGetShutdown() >= SSL_SENT_SHUTDOWN)
        return -1;

    if (buf == nullptr || nAnzahl == 0)
        return 0;

    const int iSslInit = m_pSslCon->SslInitFinished();
    if (iSslInit == 1)
    {
        int iErrorHint = 0;
        size_t nWritten = m_pSslCon->SslWrite(buf, nAnzahl, &iErrorHint);
        while (nWritten < nAnzahl && (iErrorHint == 0 || iErrorHint == SSL_ERROR_WANT_READ || iErrorHint == SSL_ERROR_WANT_WRITE) && m_pSslCon->GetShutDownFlag() == INT32_MIN)
        {
            unique_lock<mutex> lock(m_mxEnDecode);
            // Get the out Que of the openssl bio, the buffer is already encrypted
            size_t nOutDataSize = m_pSslCon->SslGetOutDataSize();
            while (nOutDataSize > 0)
            {
                auto temp = make_unique<uint8_t[]>(nOutDataSize);
                const size_t len = m_pSslCon->SslGetOutData(&temp[0], nOutDataSize);
                // Schreibt Daten in die SOCKET
                if (len > 0)
                {
                    m_mxOutDeque.lock();
                    m_atOutBytes += len;
                    m_quOutData.emplace_back(move(temp), len, strAddress);
                    m_mxOutDeque.unlock();
                }

                nOutDataSize = m_pSslCon->SslGetOutDataSize();
            }
            lock.unlock();
            nWritten += m_pSslCon->SslWrite(&buf[nWritten], nAnzahl - nWritten, &iErrorHint);
        }

        unique_lock<mutex> lock(m_mxEnDecode);
        // Get the out Que of the openssl bio, the buffer is already encrypted
        size_t nOutDataSize = m_pSslCon->SslGetOutDataSize();
        while (nOutDataSize > 0)
        {
            auto temp = make_unique<uint8_t[]>(nOutDataSize);
            const size_t len = m_pSslCon->SslGetOutData(&temp[0], nOutDataSize);
            // Schreibt Daten in die SOCKET
            if (len > 0)
            {
                m_mxOutDeque.lock();
                m_atOutBytes += len;
                m_quOutData.emplace_back(move(temp), len, strAddress);
                m_mxOutDeque.unlock();
            }
            nOutDataSize = m_pSslCon->SslGetOutDataSize();
        }
        lock.unlock();
        return 1;
    }
    else
    {
        OutputDebugString(wstring(L"SSL not initialized: " + to_wstring(reinterpret_cast<size_t>((*m_pSslCon)())) + L"\r\n").c_str());
    }

    return 0;
}